

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::erase
          (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *this,
          StringPtr *row)

{
  long lVar1;
  long lVar2;
  long lVar3;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *indexObj;
  uint row_00;
  long lVar4;
  undefined4 local_64;
  long local_60;
  long local_58;
  SearchKey local_50;
  Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *local_48;
  long *local_40;
  undefined4 *local_38;
  
  local_60 = *(long *)this;
  local_64 = *(undefined4 *)&(row->content).ptr;
  lVar3 = (long)row - local_60;
  lVar4 = lVar3 >> 2;
  local_58 = *(long *)(this + 8) - local_60 >> 2;
  local_38 = &local_64;
  local_40 = &local_60;
  local_50._vptr_SearchKey = (_func_int **)&PTR_search_001c6c20;
  row_00 = (uint)lVar4;
  local_48 = this + 0x20;
  _::BTreeImpl::erase((BTreeImpl *)(this + 0x28),row_00,&local_50);
  local_60 = *(long *)this;
  lVar1 = *(long *)(this + 8);
  lVar2 = lVar1 - local_60 >> 2;
  if (lVar2 + -1 != lVar4) {
    local_64 = *(undefined4 *)(local_60 + -4 + lVar2 * 4);
    local_50._vptr_SearchKey = (_func_int **)&PTR_search_001c6c20;
    local_40 = &local_60;
    local_38 = &local_64;
    local_58 = lVar2;
    local_48 = this + 0x20;
    _::BTreeImpl::renumber((BTreeImpl *)(this + 0x28),(uint)(lVar2 + -1),row_00,&local_50);
    *(undefined4 *)(*(long *)this + lVar3) = *(undefined4 *)(*(long *)this + -4 + lVar2 * 4);
    lVar1 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar1 + -4;
  return;
}

Assistant:

void Table<Row, Indexes...>::erase(Row& row) {
  KJ_IREQUIRE(&row >= rows.begin() && &row < rows.end(), "row is not a member of this table");
  eraseImpl(&row - rows.begin());
}